

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall
QFutureInterfaceBase::setContinuation
          (QFutureInterfaceBase *this,function<void_(const_QFutureInterfaceBase_&)> func,
          void *continuationFutureData,ContinuationType type)

{
  __pointer_type pQVar1;
  QFutureInterfaceBasePrivate *pQVar2;
  undefined8 uVar3;
  ContinuationType in_CL;
  undefined7 in_register_00000011;
  QBasicMutex *this_00;
  QFutureInterfaceBasePrivate *pQVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QMessageLogger local_50;
  long local_30;
  
  pQVar2 = (QFutureInterfaceBasePrivate *)CONCAT71(in_register_00000011,type);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->d->continuationMutex;
  if ((this->d->continuationMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar5 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar5) {
      (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar5) goto LAB_003ce97c;
  }
  else {
LAB_003ce97c:
    QBasicMutex::lockInternal(this_00);
  }
  if (((this->d->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i & 4U) != 0) {
    this->d->continuationExecuted = true;
    LOCK();
    pQVar1 = (this_00->d_ptr)._q_value._M_b._M_p;
    (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar1 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(this_00,pQVar1);
    }
    if (*(long *)((long)continuationFutureData + 0x10) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        uVar3 = std::__throw_bad_function_call();
        LOCK();
        pQVar1 = (this_00->d_ptr)._q_value._M_b._M_p;
        (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        if (pQVar1 != (__pointer_type)0x1) {
          QBasicMutex::unlockInternalFutex(this_00,pQVar1);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          _Unwind_Resume(uVar3);
        }
      }
      goto LAB_003ceaf3;
    }
    (**(code **)((long)continuationFutureData + 0x18))(continuationFutureData);
    if ((this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar5 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar5) {
        (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar5) goto LAB_003ce9e2;
    }
    QBasicMutex::lockInternal(this_00);
  }
LAB_003ce9e2:
  if ((this->d->continuationState)._M_i != Cleaned) {
    pQVar4 = this->d;
    if ((pQVar4->continuation).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_50.context.version = 2;
      local_50.context._4_8_ = 0;
      local_50.context._12_8_ = 0;
      local_50.context.function._4_4_ = 0;
      local_50.context.category = "default";
      QMessageLogger::warning
                (&local_50,
                 "Adding a continuation to a future which already has a continuation. The existing continuation is overwritten."
                );
      pQVar4 = this->d;
      if (pQVar4->continuationData != (QFutureInterfaceBasePrivate *)0x0) {
        pQVar4->continuationData->nonConcludedParent = (QFutureInterfaceBasePrivate *)0x0;
      }
    }
    std::function<void_(const_QFutureInterfaceBase_&)>::operator=
              (&pQVar4->continuation,
               (function<void_(const_QFutureInterfaceBase_&)> *)continuationFutureData);
    pQVar4 = this->d;
    if (pQVar2 != (QFutureInterfaceBasePrivate *)0x0) {
      pQVar2->continuationType = in_CL;
      pQVar2->nonConcludedParent = pQVar4;
    }
    pQVar4->continuationData = pQVar2;
  }
  LOCK();
  pQVar1 = (this_00->d_ptr)._q_value._M_b._M_p;
  (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(this_00,pQVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_003ceaf3:
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setContinuation(std::function<void (const QFutureInterfaceBase &)> func,
                                           void *continuationFutureData, ContinuationType type)
{
    auto *futureData = static_cast<QFutureInterfaceBasePrivate *>(continuationFutureData);

    QMutexLocker lock(&d->continuationMutex);

    // If the state is ready, run continuation immediately,
    // otherwise save it for later.
    if (isFinished()) {
        d->continuationExecuted = true;
        lock.unlock();
        func(*this);
        lock.relock();
    }
    // Unless the continuation has been cleaned earlier, we have to
    // store the move-only continuation, to guarantee that the associated
    // future's data stays alive.
    if (d->continuationState != QFutureInterfaceBasePrivate::Cleaned) {
        if (d->continuation) {
            qWarning("Adding a continuation to a future which already has a continuation. "
                     "The existing continuation is overwritten.");
            if (d->continuationData)
                d->continuationData->nonConcludedParent = nullptr;
        }
        d->continuation = std::move(func);
        if (futureData) {
            futureData->continuationType = type;
            futureData->nonConcludedParent = d;
        }
        d->continuationData = futureData;
        Q_ASSERT_X(!futureData || futureData->continuationType != ContinuationType::Unknown,
                   "setContinuation", "Make sure to provide a correct continuation type!");
    }
}